

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::ListBox(char *label,int *current_item,_func_bool_void_ptr_int_char_ptr_ptr *items_getter
                   ,void *data,int items_count,int height_in_items)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int int_id;
  char *item_text;
  ImGuiListClipper clipper;
  char *local_58;
  ImVec2 local_50;
  ImGuiListClipper local_48;
  
  bVar3 = ListBoxHeader(label,items_count,height_in_items);
  if (bVar3) {
    ImGuiListClipper::Begin(&local_48,items_count,GImGui->FontSize + (GImGui->Style).ItemSpacing.y);
    bVar3 = ImGuiListClipper::Step(&local_48);
    if (bVar3) {
      bVar3 = false;
      do {
        iVar2 = local_48.DisplayEnd;
        int_id = local_48.DisplayStart;
        if (local_48.DisplayStart < local_48.DisplayEnd) {
          do {
            iVar1 = *current_item;
            bVar4 = (*items_getter)(data,int_id,&local_58);
            if (!bVar4) {
              local_58 = "*Unknown item*";
            }
            PushID(int_id);
            local_50.x = 0.0;
            local_50.y = 0.0;
            bVar4 = Selectable(local_58,int_id == iVar1,0,&local_50);
            if (bVar4) {
              *current_item = int_id;
              bVar3 = true;
            }
            if (int_id == iVar1) {
              SetItemDefaultFocus();
            }
            PopID();
            int_id = int_id + 1;
          } while (iVar2 != int_id);
        }
        bVar4 = ImGuiListClipper::Step(&local_48);
      } while (bVar4);
    }
    else {
      bVar3 = false;
    }
    ListBoxFooter();
    if (local_48.ItemsCount != -1) {
      __assert_fail("ItemsCount == -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                    ,0x5df,"ImGuiListClipper::~ImGuiListClipper()");
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::ListBox(const char* label, int* current_item, bool (*items_getter)(void*, int, const char**), void* data, int items_count, int height_in_items)
{
    if (!ListBoxHeader(label, items_count, height_in_items))
        return false;

    // Assume all items have even height (= 1 line of text). If you need items of different or variable sizes you can create a custom version of ListBox() in your code without using the clipper.
    bool value_changed = false;
    ImGuiListClipper clipper(items_count, GetTextLineHeightWithSpacing()); // We know exactly our line height here so we pass it as a minor optimization, but generally you don't need to.
    while (clipper.Step())
        for (int i = clipper.DisplayStart; i < clipper.DisplayEnd; i++)
        {
            const bool item_selected = (i == *current_item);
            const char* item_text;
            if (!items_getter(data, i, &item_text))
                item_text = "*Unknown item*";

            PushID(i);
            if (Selectable(item_text, item_selected))
            {
                *current_item = i;
                value_changed = true;
            }
            if (item_selected)
                SetItemDefaultFocus();
            PopID();
        }
    ListBoxFooter();
    return value_changed;
}